

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_split(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *pgVar2;
  gravity_class_t *pgVar3;
  gravity_class_t *pgVar4;
  gravity_value_t value;
  gravity_value_t value_00;
  uint32_t uVar5;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar6;
  void *pvVar7;
  undefined8 *puVar8;
  char *pcVar9;
  gravity_value_t gVar10;
  char *local_1100;
  char *local_10f0;
  char *local_10e0;
  gravity_class_t *local_10c8;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_10c0;
  gravity_class_t *pgStack_10b0;
  uint32_t vlen;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_10a8;
  char *p;
  gravity_class_t *local_1088;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_1080;
  uint local_1070;
  uint32_t n;
  uint32_t i;
  uint32_t slen;
  char *original;
  gravity_list_t *list;
  uint32_t seplen;
  char *sep;
  gravity_string_t *substr;
  gravity_string_t *string;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if ((nargs == 2) && (args[1].isa == gravity_class_string)) {
    pgVar2 = (args->field_1).p;
    pgVar3 = (args[1].field_1.p)->objclass;
    uVar1 = *(uint *)((long)&(args[1].field_1.p)->identifier + 4);
    gravity_gc_setenabled(vm,false);
    aVar6.p = (gravity_object_t *)gravity_list_new(vm,0);
    _i = pgVar2->objclass;
    n = *(uint *)((long)&pgVar2->identifier + 4);
    if (uVar1 == 0) {
      for (local_1070 = 0; local_1070 < n; local_1070 = uVar5 + local_1070) {
        uVar5 = utf8_charbytes((char *)_i,0);
        if ((aVar6.p)->objclass == (gravity_class_t *)(aVar6.p)->identifier) {
          if ((aVar6.p)->identifier == (char *)0x0) {
            local_10e0 = (char *)0x8;
          }
          else {
            local_10e0 = (char *)((long)(aVar6.p)->identifier << 1);
          }
          (aVar6.p)->identifier = local_10e0;
          pvVar7 = realloc(*(void **)&(aVar6.p)->has_outer,(long)(aVar6.p)->identifier << 4);
          *(void **)&(aVar6.p)->has_outer = pvVar7;
        }
        pgVar3 = (aVar6.p)->objclass;
        (aVar6.p)->objclass = (gravity_class_t *)((long)&pgVar3->isa + 1);
        puVar8 = (undefined8 *)(*(long *)&(aVar6.p)->has_outer + (long)pgVar3 * 0x10);
        gVar10 = gravity_string_to_value(vm,(char *)_i,uVar5);
        local_1088 = gVar10.isa;
        *puVar8 = local_1088;
        local_1080 = gVar10.field_1;
        ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(puVar8 + 1))->n =
             (gravity_int_t)local_1080;
        _i = (gravity_class_t *)((long)&_i->isa + (ulong)uVar5);
      }
      gravity_gc_setenabled(vm,true);
      value_00.field_1.p = (gravity_object_t *)aVar6.n;
      value_00.isa = (aVar6.p)->isa;
      gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
    else {
      while (pcVar9 = string_strnstr((char *)_i,(char *)pgVar3,(ulong)n), pcVar9 != (char *)0x0) {
        uVar5 = (int)pcVar9 - (int)_i;
        if ((aVar6.p)->objclass == (gravity_class_t *)(aVar6.p)->identifier) {
          if ((aVar6.p)->identifier == (char *)0x0) {
            local_1100 = (char *)0x8;
          }
          else {
            local_1100 = (char *)((long)(aVar6.p)->identifier << 1);
          }
          (aVar6.p)->identifier = local_1100;
          pvVar7 = realloc(*(void **)&(aVar6.p)->has_outer,(long)(aVar6.p)->identifier << 4);
          *(void **)&(aVar6.p)->has_outer = pvVar7;
        }
        pgVar4 = (aVar6.p)->objclass;
        (aVar6.p)->objclass = (gravity_class_t *)((long)&pgVar4->isa + 1);
        puVar8 = (undefined8 *)(*(long *)&(aVar6.p)->has_outer + (long)pgVar4 * 0x10);
        gVar10 = gravity_string_to_value(vm,(char *)_i,uVar5);
        local_10c8 = gVar10.isa;
        *puVar8 = local_10c8;
        local_10c0 = gVar10.field_1;
        ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(puVar8 + 1))->n =
             (gravity_int_t)local_10c0;
        _i = (gravity_class_t *)(pcVar9 + uVar1);
        n = n - (uVar5 + uVar1);
      }
      if ((aVar6.p)->objclass == (gravity_class_t *)(aVar6.p)->identifier) {
        if ((aVar6.p)->identifier == (char *)0x0) {
          local_10f0 = (char *)0x8;
        }
        else {
          local_10f0 = (char *)((long)(aVar6.p)->identifier << 1);
        }
        (aVar6.p)->identifier = local_10f0;
        pvVar7 = realloc(*(void **)&(aVar6.p)->has_outer,(long)(aVar6.p)->identifier << 4);
        *(void **)&(aVar6.p)->has_outer = pvVar7;
      }
      pgVar3 = (aVar6.p)->objclass;
      (aVar6.p)->objclass = (gravity_class_t *)((long)&pgVar3->isa + 1);
      puVar8 = (undefined8 *)(*(long *)&(aVar6.p)->has_outer + (long)pgVar3 * 0x10);
      gVar10 = gravity_string_to_value(vm,(char *)_i,n);
      pgStack_10b0 = gVar10.isa;
      *puVar8 = pgStack_10b0;
      local_10a8 = gVar10.field_1;
      ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(puVar8 + 1))->n = (gravity_int_t)local_10a8
      ;
      gravity_gc_setenabled(vm,true);
      value.field_1.p = (gravity_object_t *)aVar6.n;
      value.isa = (aVar6.p)->isa;
      gravity_vm_setslot(vm,value,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
  }
  else {
    snprintf(local_1028,0x1000,"String.split() expects 1 string separator.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    gVar10.field_1.n = 0;
    gVar10.isa = gravity_class_null;
    gravity_vm_setslot(vm,gVar10,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_split (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // sanity check
    if ((nargs != 2) || (!VALUE_ISA_STRING(GET_VALUE(1)))) RETURN_ERROR("String.split() expects 1 string separator.");

    // setup arguments
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *substr = VALUE_AS_STRING(GET_VALUE(1));
    const char *sep = substr->s;
    uint32_t seplen = substr->len;
    
    // this is a quite complex situation
    // list should not be trasferred to GC bacause it could be freed by VALUE_FROM_STRING
    // and the same applied to each VALUE_FROM_STRING
    // but in order to use NULL as vm parameter I should keep track of each individual allocation here
    // and then transfer all of them to the VM at the end of the loop (in order to be able to have them
    // freed by the GC)
    // I think it is too much work, the easier solution is just to disable GC during execution loop
    
    gravity_gc_setenabled(vm, false);

    // initialize the list to have a size of 0
    gravity_list_t *list = gravity_list_new(vm, 0);

    char *original = string->s;
    uint32_t slen = string->len;

    // if the separator is empty, then we split the string at every character
    if (seplen == 0) {
        for (uint32_t i=0; i<slen;) {
            uint32_t n = utf8_charbytes(original, 0);
            marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, n));
            original += n;
            i += n;
        }
        gravity_gc_setenabled(vm, true);
        RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
    }

    // split loop
    while (1) {
        char *p = string_strnstr(original, sep, (size_t)slen);
        if (p == NULL) {
			marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, slen));
            break;
        }
        uint32_t vlen = (uint32_t)(p-original);
		marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, vlen));

        // update pointer and slen
        original = p + seplen;
        slen -= vlen + seplen;
    }
    
    gravity_gc_setenabled(vm, true);
    RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}